

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-birth.c
# Opt level: O0

void race_help(wchar_t i,void *db,region *l)

{
  _Bool _Var1;
  int iVar2;
  player_race *ppVar3;
  wchar_t adj;
  char *name;
  wchar_t flag_space;
  wchar_t n_flags;
  player_ability *ability;
  wchar_t len;
  player_race *r;
  wchar_t j;
  region *l_local;
  void *db_local;
  wchar_t i_local;
  
  ppVar3 = player_id2race(i);
  name._4_4_ = 0;
  if (ppVar3 != (player_race *)0x0) {
    text_out_hook = text_out_to_screen;
    text_out_indent = L'\x13';
    Term_gotoxy(L'\x13',L'\t');
    for (r._4_4_ = 0; r._4_4_ < 3; r._4_4_ = r._4_4_ + 1) {
      text_out_e("%s%+3d",stat_names_reduced[r._4_4_],(ulong)(uint)ppVar3->r_adj[r._4_4_]);
      if (r._4_4_ * 2 + 1 < 5) {
        text_out_e("  %s%+3d",stat_names_reduced[r._4_4_ + 3],
                   (ulong)(uint)ppVar3->r_adj[r._4_4_ + 3]);
      }
      text_out("\n");
    }
    text_out_e("\n");
    skill_help(ppVar3->r_skills,(int *)0x0,ppVar3->r_mhp,ppVar3->r_exp,ppVar3->infra);
    text_out_e("\n");
    _flag_space = player_abilities;
    while ((_flag_space != (player_ability *)0x0 && (name._4_4_ < 3))) {
      iVar2 = strcmp(_flag_space->type,"object");
      if ((((iVar2 != 0) ||
           (_Var1 = flag_has_dbg(ppVar3->flags,5,(uint)_flag_space->index,"r->flags",
                                 "ability->index"), _Var1)) &&
          ((iVar2 = strcmp(_flag_space->type,"player"), iVar2 != 0 ||
           (_Var1 = flag_has_dbg(ppVar3->pflags,3,(uint)_flag_space->index,"r->pflags",
                                 "ability->index"), _Var1)))) &&
         ((iVar2 = strcmp(_flag_space->type,"element"), iVar2 != 0 ||
          ((int)ppVar3->el_info[_flag_space->index].res_level == _flag_space->value)))) {
        text_out_e("\n%s",_flag_space->name);
        name._4_4_ = name._4_4_ + 1;
      }
      _flag_space = _flag_space->next;
    }
    for (; name._4_4_ < 3; name._4_4_ = name._4_4_ + 1) {
      text_out_e("\n");
    }
    text_out_indent = L'\0';
  }
  return;
}

Assistant:

static void race_help(int i, void *db, const region *l)
{
	int j;
	struct player_race *r = player_id2race(i);
	int len = (STAT_MAX + 1) / 2;

	struct player_ability *ability;
	int n_flags = 0;
	int flag_space = 3;

	if (!r) return;

	/* Output to the screen */
	text_out_hook = text_out_to_screen;
	
	/* Indent output */
	text_out_indent = RACE_AUX_COL;
	Term_gotoxy(RACE_AUX_COL, TABLE_ROW);

	for (j = 0; j < len; j++) {  
		const char *name = stat_names_reduced[j];
		int adj = r->r_adj[j];

		text_out_e("%s%+3d", name, adj);

		if (j * 2 + 1 < STAT_MAX) {
			name = stat_names_reduced[j + len];
			adj = r->r_adj[j + len];
			text_out_e("  %s%+3d", name, adj);
		}

		text_out("\n");
	}
	
	text_out_e("\n");
	skill_help(r->r_skills, NULL, r->r_mhp, r->r_exp, r->infra);
	text_out_e("\n");

	for (ability = player_abilities; ability; ability = ability->next) {
		if (n_flags >= flag_space) break;
		if (streq(ability->type, "object") &&
			!of_has(r->flags, ability->index)) {
			continue;
		} else if (streq(ability->type, "player") &&
				   !pf_has(r->pflags, ability->index)) {
			continue;
		} else if (streq(ability->type, "element") &&
				   (r->el_info[ability->index].res_level != ability->value)) {
			continue;
		}
		text_out_e("\n%s", ability->name);
		n_flags++;
	}

	while (n_flags < flag_space) {
		text_out_e("\n");
		n_flags++;
	}

	/* Reset text_out() indentation */
	text_out_indent = 0;
}